

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O0

AC3ParseError __thiscall AC3Codec::parseHeader(AC3Codec *this,uint8_t *buf,uint8_t *end)

{
  uint8_t uVar1;
  bool bVar2;
  uchar uVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  byte *buf_00;
  bool local_b9;
  int local_b8;
  int local_b4;
  undefined1 local_a8 [8];
  BitStreamReader gbc_1;
  uint complexity_index_type_a;
  int iStack_78;
  bool flag_ec3_extension_type_a;
  int blk;
  int i_1;
  uchar mixdeflen;
  short chanmap;
  int i;
  uchar lfeon;
  uchar acmod;
  int number_of_blocks_per_syncframe;
  uchar m_fscod2;
  uchar fscod;
  BitStreamReader gbc;
  int pgmscle;
  int paninfoe;
  int extpgmscle;
  uint8_t mixdef;
  uint8_t numblkscod;
  uint8_t dsurmod;
  uint8_t bsmod;
  uint8_t id;
  uint8_t *end_local;
  uint8_t *buf_local;
  AC3Codec *this_local;
  
  if ((*buf == '\v') && (buf_00 = buf + 2, buf[1] == 'w')) {
    bVar4 = (byte)((int)(uint)buf[5] >> 3);
    if (bVar4 < 0x11) {
      this->m_bsid = bVar4;
      if (this->m_bsid < 0xb) {
        this->m_fscod = (uint8_t)((int)(uint)buf[4] >> 6);
        if (this->m_fscod == '\x03') {
          return SAMPLE_RATE;
        }
        this->m_frmsizecod = buf[4] & 0x3f;
        if (0x25 < this->m_frmsizecod) {
          return FRAME_SIZE;
        }
        this->m_frame_size = (uint)ff_ac3_frame_sizes[this->m_frmsizecod][this->m_fscod] << 1;
        if (end + 2 < buf_00 + this->m_frame_size) {
          return NOT_ENOUGH_BUFFER;
        }
        bVar2 = crc32(buf_00,this->m_frame_size + -4);
        if (!bVar2) {
          return CRC2;
        }
        BitStreamReader::BitStreamReader((BitStreamReader *)local_a8);
        BitStreamReader::setBuffer((BitStreamReader *)local_a8,buf + 5,end);
        this->m_bsidBase = this->m_bsid;
        this->m_strmtyp = '\x02';
        this->m_samples = 0x600;
        BitStreamReader::skipBits((BitStreamReader *)local_a8,5);
        uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_a8,3);
        this->m_bsmod = uVar3;
        uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_a8,3);
        this->m_acmod = uVar3;
        if (((this->m_acmod & 1) != 0) && (this->m_acmod != '\x01')) {
          BitStreamReader::skipBits((BitStreamReader *)local_a8,2);
        }
        if ((this->m_acmod & 4) != 0) {
          BitStreamReader::skipBits((BitStreamReader *)local_a8,2);
        }
        if (this->m_acmod == '\x02') {
          uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_a8,2);
          this->m_dsurmod = uVar3;
        }
        uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_a8,1);
        this->m_lfeon = uVar3;
        if (this->m_bsid < 9) {
          uVar1 = '\b';
        }
        else {
          uVar1 = this->m_bsid;
        }
        this->m_halfratecod = uVar1 + 0xf8;
        this->m_sample_rate = (int)(uint)ff_ac3_freqs[this->m_fscod] >> (this->m_halfratecod & 0x1f)
        ;
        this->m_bit_rate =
             (int)((uint)ff_ac3_bitratetab[this->m_frmsizecod >> 1] * 1000) >>
             (this->m_halfratecod & 0x1f);
        this->m_channels = "\x02\x01\x02\x03\x03\x04\x04\x05"[this->m_acmod] + this->m_lfeon;
      }
      else {
        this->m_frame_size = (((*buf_00 & 7) << 8 | (uint)buf[3]) + 1) * 2;
        if (this->m_frame_size < 7) {
          return FRAME_SIZE;
        }
        if (end + 2 < buf_00 + this->m_frame_size) {
          return NOT_ENOUGH_BUFFER;
        }
        bVar2 = crc32(buf_00,this->m_frame_size + -4);
        if (!bVar2) {
          return CRC2;
        }
        extpgmscle._2_1_ = '\0';
        extpgmscle._1_1_ = '\0';
        paninfoe._3_1_ = '\0';
        bVar2 = false;
        pgmscle = 0;
        gbc.m_bitLeft = 0;
        BitStreamReader::BitStreamReader((BitStreamReader *)&number_of_blocks_per_syncframe);
        BitStreamReader::setBuffer((BitStreamReader *)&number_of_blocks_per_syncframe,buf_00,end);
        uVar3 = BitStreamReader::getBits<unsigned_char>
                          ((BitStreamReader *)&number_of_blocks_per_syncframe,2);
        this->m_strmtyp = uVar3;
        if (this->m_strmtyp == '\x03') {
          return SYNC;
        }
        BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,0xe);
        bVar4 = BitStreamReader::getBits<unsigned_char>
                          ((BitStreamReader *)&number_of_blocks_per_syncframe,2);
        if (bVar4 == 3) {
          bVar5 = BitStreamReader::getBits<unsigned_char>
                            ((BitStreamReader *)&number_of_blocks_per_syncframe,2);
          if (bVar5 == 3) {
            return SYNC;
          }
          extpgmscle._0_1_ = 3;
          this->m_sample_rate = ff_ac3_freqs[bVar5] / 2;
        }
        else {
          extpgmscle._0_1_ =
               BitStreamReader::getBits<unsigned_char>
                         ((BitStreamReader *)&number_of_blocks_per_syncframe,2);
          this->m_sample_rate = (uint)ff_ac3_freqs[bVar4];
        }
        if ((byte)extpgmscle == 0) {
          local_b4 = 1;
        }
        else {
          if ((byte)extpgmscle == 1) {
            local_b8 = 2;
          }
          else {
            local_b8 = 6;
            if ((byte)extpgmscle == 2) {
              local_b8 = 3;
            }
          }
          local_b4 = local_b8;
        }
        bVar5 = BitStreamReader::getBits<unsigned_char>
                          ((BitStreamReader *)&number_of_blocks_per_syncframe,3);
        uVar3 = BitStreamReader::getBits<unsigned_char>
                          ((BitStreamReader *)&number_of_blocks_per_syncframe,1);
        this->m_samples = (uint)"\x01\x02\x03\x06"[(byte)extpgmscle] << 8;
        this->m_bit_rateExt = (this->m_frame_size * this->m_sample_rate * 8) / this->m_samples;
        BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
        i_1 = 0;
        while( true ) {
          iVar10 = 2;
          if (bVar5 != 0) {
            iVar10 = 1;
          }
          if (iVar10 <= i_1) break;
          BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
          bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
          if (bVar6) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,8);
          }
          i_1 = i_1 + 1;
        }
        if (((this->m_strmtyp == '\x01') &&
            (bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe),
            bVar6)) &&
           (uVar8 = BitStreamReader::getBits<short>
                              ((BitStreamReader *)&number_of_blocks_per_syncframe,0x10),
           (uVar8 & 0x7fe0) != 0)) {
          this->m_extChannelsExists = true;
        }
        bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
        if (bVar6) {
          if (2 < bVar5) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,2);
          }
          if (((bVar5 & 1) != 0) && (2 < bVar5)) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,6);
          }
          if ((bVar5 & 4) != 0) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,6);
          }
          if ((uVar3 != '\0') &&
             (bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe),
             bVar6)) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
          }
          if (this->m_strmtyp == '\0') {
            bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
            gbc.m_bitLeft = (uint)bVar6;
            if (gbc.m_bitLeft != 0) {
              BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,6);
            }
            if ((bVar5 == 0) &&
               (bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe),
               bVar6)) {
              BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,6);
            }
            bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
            pgmscle = (int)bVar6;
            if (pgmscle != 0) {
              BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,6);
            }
            paninfoe._3_1_ =
                 BitStreamReader::getBits<unsigned_char>
                           ((BitStreamReader *)&number_of_blocks_per_syncframe,2);
            if (paninfoe._3_1_ == '\x01') {
              BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
            }
            else if (paninfoe._3_1_ == '\x02') {
              BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,0xc);
            }
            else if (paninfoe._3_1_ == '\x03') {
              bVar7 = BitStreamReader::getBits<unsigned_char>
                                ((BitStreamReader *)&number_of_blocks_per_syncframe,5);
              bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
              if (bVar6) {
                BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                }
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                }
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                }
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                }
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                }
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                }
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                }
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  bVar6 = BitStreamReader::getBit
                                    ((BitStreamReader *)&number_of_blocks_per_syncframe);
                  if (bVar6) {
                    BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                  }
                  bVar6 = BitStreamReader::getBit
                                    ((BitStreamReader *)&number_of_blocks_per_syncframe);
                  if (bVar6) {
                    BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,4);
                  }
                }
              }
              bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
              if (bVar6) {
                BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
                bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
                if (bVar6) {
                  BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,7);
                  bVar6 = BitStreamReader::getBit
                                    ((BitStreamReader *)&number_of_blocks_per_syncframe);
                  if (bVar6) {
                    BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,7);
                  }
                }
              }
              for (iStack_78 = 0; iStack_78 < (int)(bVar7 + 2); iStack_78 = iStack_78 + 1) {
                BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,8);
              }
              BitStreamReader::alignByte((BitStreamReader *)&number_of_blocks_per_syncframe);
            }
            if (bVar5 < 2) {
              bVar2 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
              if (bVar2) {
                BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,0xe);
              }
              if ((bVar5 == 0) &&
                 (bVar6 = BitStreamReader::getBit
                                    ((BitStreamReader *)&number_of_blocks_per_syncframe), bVar6)) {
                BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,0xe);
              }
            }
            bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
            if (bVar6) {
              if ((byte)extpgmscle == 0) {
                BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
              }
              else {
                for (complexity_index_type_a = 0; (int)complexity_index_type_a < local_b4;
                    complexity_index_type_a = complexity_index_type_a + 1) {
                  bVar6 = BitStreamReader::getBit
                                    ((BitStreamReader *)&number_of_blocks_per_syncframe);
                  if (bVar6) {
                    BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,5);
                  }
                }
              }
            }
          }
        }
        bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
        if (bVar6) {
          extpgmscle._2_1_ =
               BitStreamReader::getBits<unsigned_char>
                         ((BitStreamReader *)&number_of_blocks_per_syncframe,3);
          BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,2);
          if (bVar5 == 2) {
            extpgmscle._1_1_ =
                 BitStreamReader::getBits<unsigned_char>
                           ((BitStreamReader *)&number_of_blocks_per_syncframe,2);
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,2);
          }
          else if (5 < bVar5) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,2);
          }
          bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
          if (bVar6) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,8);
          }
          if ((bVar5 == 0) &&
             (bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe),
             bVar6)) {
            BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,8);
          }
          if (bVar4 < 3) {
            BitStreamReader::skipBit((BitStreamReader *)&number_of_blocks_per_syncframe);
          }
        }
        if ((this->m_strmtyp == '\0') && ((byte)extpgmscle != 3)) {
          BitStreamReader::skipBit((BitStreamReader *)&number_of_blocks_per_syncframe);
        }
        if ((this->m_strmtyp == '\x02') &&
           (((byte)extpgmscle == 3 ||
            (bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe),
            bVar6)))) {
          BitStreamReader::skipBits((BitStreamReader *)&number_of_blocks_per_syncframe,6);
        }
        bVar6 = BitStreamReader::getBit((BitStreamReader *)&number_of_blocks_per_syncframe);
        if ((((bVar6) &&
             (uVar9 = BitStreamReader::getBits((BitStreamReader *)&number_of_blocks_per_syncframe,6)
             , uVar9 == 1)) &&
            (uVar9 = BitStreamReader::getBits((BitStreamReader *)&number_of_blocks_per_syncframe,8),
            uVar9 == 1)) &&
           (uVar9 = BitStreamReader::getBits((BitStreamReader *)&number_of_blocks_per_syncframe,8),
           uVar9 < 0x11)) {
          this->m_isAtmos = true;
        }
        local_b9 = true;
        if (((gbc.m_bitLeft == 0) && (local_b9 = true, pgmscle == 0)) &&
           (local_b9 = true, paninfoe._3_1_ == '\0')) {
          local_b9 = bVar2 != false;
        }
        this->m_mixinfoexists = local_b9;
        if (this->m_channels == '\0') {
          this->m_acmod = bVar5;
          this->m_lfeon = uVar3;
          this->m_bsmod = extpgmscle._2_1_;
          this->m_fscod = bVar4;
          this->m_dsurmod = extpgmscle._1_1_;
          this->m_channels = "\x02\x01\x02\x03\x03\x04\x04\x05"[bVar5] + uVar3;
        }
      }
      this_local._4_4_ = NO_ERROR;
    }
    else {
      this_local._4_4_ = BSID;
    }
  }
  else {
    this_local._4_4_ = SYNC;
  }
  return this_local._4_4_;
}

Assistant:

AC3Codec::AC3ParseError AC3Codec::parseHeader(uint8_t *buf, const uint8_t *end)
{
    if (*buf++ != 0x0B || *buf++ != 0x77)
        return AC3ParseError::SYNC;

    // read ahead to bsid to make sure this is AC-3, not E-AC-3
    const uint8_t id = buf[3] >> 3;
    if (id > 16)
        return AC3ParseError::BSID;

    m_bsid = id;

    // ---------------------------------- EAC3 ------------------------------------------
    if (m_bsid > 10)
    {
        m_frame_size = static_cast<uint16_t>((((buf[0] & 0x07) << 8 | buf[1]) + 1) << 1);
        if (m_frame_size < AC3_HEADER_SIZE)
            return AC3ParseError::FRAME_SIZE;  // invalid header size

        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        uint8_t bsmod = 0, dsurmod = 0, numblkscod, mixdef = 0;
        int extpgmscle, paninfoe;
        int pgmscle = extpgmscle = paninfoe = 0;

        BitStreamReader gbc{};
        gbc.setBuffer(buf, end);

        m_strmtyp = gbc.getBits<uint8_t>(2);
        if (m_strmtyp == 3)
            return AC3ParseError::SYNC;  // invalid stream type

        gbc.skipBits(14);  // substreamid, frmsize

        const auto fscod = gbc.getBits<uint8_t>(2);

        if (fscod == 3)
        {
            const auto m_fscod2 = gbc.getBits<uint8_t>(2);
            if (m_fscod2 == 3)
                return AC3ParseError::SYNC;

            numblkscod = 3;
            m_sample_rate = ff_ac3_freqs[m_fscod2] / 2;
        }
        else
        {
            numblkscod = gbc.getBits<uint8_t>(2);
            m_sample_rate = ff_ac3_freqs[fscod];
        }
        const int number_of_blocks_per_syncframe =
            numblkscod == 0 ? 1 : (numblkscod == 1 ? 2 : (numblkscod == 2 ? 3 : 6));
        const auto acmod = gbc.getBits<uint8_t>(3);
        const auto lfeon = gbc.getBits<uint8_t>(1);

        m_samples = eac3_blocks[numblkscod] << 8;
        m_bit_rateExt = m_frame_size * m_sample_rate * 8 / m_samples;

        gbc.skipBits(5);  // skip bsid, already got it
        for (int i = 0; i < (acmod ? 1 : 2); i++)
        {
            gbc.skipBits(5);  // skip dialog normalization
            if (gbc.getBit())
                gbc.skipBits(8);  // skip Compression gain word
        }

        if (m_strmtyp == 1)  // dependent EAC3 frame
        {
            if (gbc.getBit())
            {
                const auto chanmap = gbc.getBits<int16_t>(16);
                if (chanmap & 0x7fe0)  // mask standard 5.1 channels
                    m_extChannelsExists = true;
            }
        }

        if (gbc.getBit())  // mixing metadata
        {
            if (acmod > 2)
                gbc.skipBits(2);  // dmixmod
            if (acmod & 1 && acmod > 0x2)
                gbc.skipBits(6);  // ltrtcmixlev, lorocmixlev
            if (acmod & 4)
                gbc.skipBits(6);  // ltrtsurmixlev, lorosurmixlev
            if (lfeon && gbc.getBit())
                gbc.skipBits(5);  // lfemixlevcod
            if (m_strmtyp == 0)   // independent EAC3 frame
            {
                pgmscle = gbc.getBit();
                if (pgmscle)
                    gbc.skipBits(6);  // pgmscl
                if (acmod == 0 && gbc.getBit())
                    gbc.skipBits(6);  // pgmscl2
                extpgmscle = gbc.getBit();
                if (extpgmscle)
                    gbc.skipBits(6);  // extpgmscl
                mixdef = gbc.getBits<uint8_t>(2);
                if (mixdef == 1)
                    gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                else if (mixdef == 2)
                    gbc.skipBits(12);  // mixdata
                else if (mixdef == 3)
                {
                    const auto mixdeflen = gbc.getBits<uint8_t>(5);
                    if (gbc.getBit())  // mixdata2e
                    {
                        gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmcscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrsscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlfescl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // dmixscl
                        if (gbc.getBit())     // addch exist
                        {
                            if (gbc.getBit())     // extpgmaux1scl exist
                                gbc.skipBits(4);  // extpgmaux1scl
                            if (gbc.getBit())     // extpgmaux2scl exist
                                gbc.skipBits(4);  // extpgmaux2scl
                        }
                    }
                    if (gbc.getBit())  // mixdata3e
                    {
                        gbc.skipBits(5);   // spchdat
                        if (gbc.getBit())  // addspchdat exist
                        {
                            gbc.skipBits(7);      // spchdat1, spchan1att
                            if (gbc.getBit())     // addspchdat2 exist
                                gbc.skipBits(7);  // spchdat2, spchan2att
                        }
                    }
                    for (int i = 0; i < mixdeflen + 2; i++) gbc.skipBits(8);  // mixdata
                    gbc.alignByte();                                          // mixdatafill
                }
                if (acmod < 2)
                {
                    paninfoe = gbc.getBit();
                    if (paninfoe)
                        gbc.skipBits(14);  // panmean, paninfo
                    if (acmod == 0 && gbc.getBit())
                        gbc.skipBits(14);  // panmean2, paninfo2
                }
                if (gbc.getBit())
                {
                    if (numblkscod == 0)
                        gbc.skipBits(5);  // blkmixcfginfo[0]
                    else
                        for (int blk = 0; blk < number_of_blocks_per_syncframe; blk++)
                            if (gbc.getBit())
                                gbc.skipBits(5);  // blkmixcfginfo[blk]
                }
            }
        }

        if (gbc.getBit()) /* informational metadata */
        {
            bsmod = gbc.getBits<uint8_t>(3);
            gbc.skipBits(2);  // copyrightb, origbs
            if (acmod == 2)
            {
                dsurmod = gbc.getBits<uint8_t>(2);
                gbc.skipBits(2);  // dheadphonmod
            }
            else if (acmod >= 6)  /* if both surround channels exist */
                gbc.skipBits(2);  // dsurexmod
            if (gbc.getBit())     // audprodie
                gbc.skipBits(8);  // mixlevel, roomtype, adconvtyp
            if (acmod == 0)       /* if 1+1 mode (dual mono, so some items need a second value) */
            {
                if (gbc.getBit())     // audprodi2e
                    gbc.skipBits(8);  // mixlevel2, roomtype2, adconvtyp2
            }
            if (fscod < 3)      /* if not half sample rate */
                gbc.skipBit();  // sourcefscod
        }

        if (m_strmtyp == 0 && numblkscod != 3)
            gbc.skipBit();  // convsync

        if (m_strmtyp == 2) /* if bit stream converted from AC-3 */
        {
            if (numblkscod == 3 || gbc.getBit())  // blkid
                gbc.skipBits(6);                  // frmsizecod
        }

        if (gbc.getBit())  // addbsi exist
        {
            if (gbc.getBits(6) == 1)  // addbsi length
            {
                // ETSI TS 103 420 - Backwards-compatible object audio carriage using Enhanced AC-3
                // para. 8.3 Extensions contained in the addbsi bitstream field
                // TODO: conditions below might not be sufficient to detect Atmos
                // ideally, detect payload syncword (but where is it located ?)
                const auto flag_ec3_extension_type_a = gbc.getBits(8) == 1;
                if (flag_ec3_extension_type_a)
                {
                    const auto complexity_index_type_a = gbc.getBits(8);
                    if (complexity_index_type_a <= 16)
                        m_isAtmos = true;
                }
            }
        }

        m_mixinfoexists = pgmscle || extpgmscle || mixdef > 0 || paninfoe;

        if (m_channels == 0)  // no AC3 interleave
        {
            m_acmod = acmod;
            m_lfeon = lfeon;
            m_bsmod = bsmod;
            m_fscod = fscod;
            m_dsurmod = dsurmod;
            m_channels = static_cast<uint8_t>(ff_ac3_channels[acmod] + lfeon);
        }
    }
    // ---------------------------------- AC3 ------------------------------------------
    else
    {
        m_fscod = buf[2] >> 6;
        if (m_fscod == 3)
            return AC3ParseError::SAMPLE_RATE;

        m_frmsizecod = buf[2] & 0x3f;
        if (m_frmsizecod > 37)
            return AC3ParseError::FRAME_SIZE;

        m_frame_size = ff_ac3_frame_sizes[m_frmsizecod][m_fscod] << 1;
        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        BitStreamReader gbc{};
        gbc.setBuffer(buf + 3, end);

        m_bsidBase = m_bsid;  // id except AC3+ frames
        m_strmtyp = 2;
        m_samples = AC3_FRAME_SIZE;

        gbc.skipBits(5);  // skip bsid, already got it
        m_bsmod = gbc.getBits<uint8_t>(3);
        m_acmod = gbc.getBits<uint8_t>(3);
        if ((m_acmod & 1) && m_acmod != AC3_ACMOD_MONO)  // 3 front channels
            gbc.skipBits(2);                             // m_cmixlev
        if (m_acmod & 4)                                 // surround channel exists
            gbc.skipBits(2);                             // m_surmixlev
        if (m_acmod == AC3_ACMOD_STEREO)
            m_dsurmod = gbc.getBits<uint8_t>(2);
        m_lfeon = gbc.getBits<uint8_t>(1);

        m_halfratecod = max(m_bsid, 8) - 8;
        m_sample_rate = ff_ac3_freqs[m_fscod] >> m_halfratecod;
        m_bit_rate = (ff_ac3_bitratetab[m_frmsizecod >> 1] * 1000) >> m_halfratecod;
        m_channels = static_cast<uint8_t>(ff_ac3_channels[m_acmod] + m_lfeon);
    }
    return AC3ParseError::NO_ERROR;
}